

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fgetline.c
# Opt level: O0

char * fgetline(FILE *fp)

{
  char *pcVar1;
  size_t sVar2;
  size_t local_30;
  size_t len;
  size_t size;
  char *ret;
  FILE *fp_local;
  
  ret = (char *)fp;
  size = (size_t)safemalloc(0x200,1,0);
  len = 0x200;
  local_30 = 0;
  while (pcVar1 = fgets((char *)(size + local_30),(int)len - (int)local_30,(FILE *)ret),
        pcVar1 != (char *)0x0) {
    sVar2 = strlen((char *)(size + local_30));
    local_30 = sVar2 + local_30;
    if ((local_30 != 0) && (*(char *)(size + (local_30 - 1)) == '\n')) break;
    size = (size_t)safegrowarray((void *)size,&len,1,local_30,0x200,true);
  }
  if (local_30 == 0) {
    safefree((void *)size);
    fp_local = (FILE *)0x0;
  }
  else {
    *(undefined1 *)(size + local_30) = 0;
    fp_local = (FILE *)size;
  }
  return (char *)fp_local;
}

Assistant:

char *fgetline(FILE *fp)
{
    char *ret = snewn(512, char);
    size_t size = 512, len = 0;
    while (fgets(ret + len, size - len, fp)) {
        len += strlen(ret + len);
        if (len > 0 && ret[len-1] == '\n')
            break;                     /* got a newline, we're done */
        sgrowarrayn_nm(ret, size, len, 512);
    }
    if (len == 0) {                    /* first fgets returned NULL */
        sfree(ret);
        return NULL;
    }
    ret[len] = '\0';
    return ret;
}